

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O3

void __thiscall
gvr::ColoredPointCloud::savePLY(ColoredPointCloud *this,char *name,bool all,ply_encoding enc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ply_encoding pVar2;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_01;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_02;
  void *pvVar3;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  int iVar4;
  string *psVar5;
  long lVar6;
  long lVar7;
  PLYWriter ply;
  string local_298;
  PLYWriter local_278;
  
  psVar5 = &local_298;
  pVar2 = enc;
  PLYWriter::PLYWriter(&local_278);
  PLYWriter::open(&local_278,name,enc);
  Model::setOriginToPLY((Model *)this,&local_278);
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"vertex","");
  PLYWriter::addElement(&local_278,&local_298,(long)(this->super_PointCloud).n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"x","");
  PLYWriter::addProperty(&local_278,&local_298,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"y","");
  PLYWriter::addProperty(&local_278,&local_298,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"z","");
  PLYWriter::addProperty(&local_278,&local_298,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((this->super_PointCloud).scanprop == (float *)0x0) {
    if (!all) goto LAB_0011a9c2;
  }
  else {
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"scan_size","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if (!all) goto LAB_0011a9c2;
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"scan_error","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"scan_conf","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
  }
  if ((this->super_PointCloud).scanpos != (float *)0x0) {
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"sx","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"sy","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"sz","");
    PLYWriter::addProperty(&local_278,&local_298,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
  }
LAB_0011a9c2:
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"diffuse_red","");
  PLYWriter::addProperty(&local_278,&local_298,ply_uint8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"diffuse_green","");
  PLYWriter::addProperty(&local_278,&local_298,ply_uint8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"diffuse_blue","");
  PLYWriter::addProperty(&local_278,&local_298,ply_uint8);
  pvVar3 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
    pvVar3 = extraout_RDX_00;
  }
  iVar4 = (int)psVar5;
  if (0 < (this->super_PointCloud).n) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      iVar4 = (int)psVar5;
      PLYWriter::write(&local_278,iVar4,pvVar3,CONCAT44(in_register_0000000c,pVar2));
      PLYWriter::write(&local_278,iVar4,__buf,CONCAT44(in_register_0000000c,pVar2));
      PLYWriter::write(&local_278,iVar4,__buf_00,CONCAT44(in_register_0000000c,pVar2));
      if ((this->super_PointCloud).scanprop == (float *)0x0) {
        pvVar3 = __buf_01;
        if (all) goto LAB_0011ab17;
      }
      else {
        PLYWriter::write(&local_278,iVar4,__buf_01,CONCAT44(in_register_0000000c,pVar2));
        pvVar3 = __buf_02;
        if (all) {
          PLYWriter::write(&local_278,iVar4,__buf_02,CONCAT44(in_register_0000000c,pVar2));
          PLYWriter::write(&local_278,iVar4,__buf_03,CONCAT44(in_register_0000000c,pVar2));
          pvVar3 = extraout_RDX_01;
LAB_0011ab17:
          if ((this->super_PointCloud).scanpos != (float *)0x0) {
            PLYWriter::write(&local_278,iVar4,pvVar3,CONCAT44(in_register_0000000c,pVar2));
            PLYWriter::write(&local_278,iVar4,__buf_04,CONCAT44(in_register_0000000c,pVar2));
            PLYWriter::write(&local_278,iVar4,__buf_05,CONCAT44(in_register_0000000c,pVar2));
            pvVar3 = extraout_RDX_02;
          }
        }
      }
      PLYWriter::write(&local_278,(uint)this->rgb[lVar6],pvVar3,CONCAT44(in_register_0000000c,pVar2)
                      );
      PLYWriter::write(&local_278,(uint)this->rgb[lVar6 + 1],__buf_06,
                       CONCAT44(in_register_0000000c,pVar2));
      psVar5 = (string *)(ulong)this->rgb[lVar6 + 2];
      PLYWriter::write(&local_278,(uint)this->rgb[lVar6 + 2],__buf_07,
                       CONCAT44(in_register_0000000c,pVar2));
      iVar4 = (int)psVar5;
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 3;
      pvVar3 = extraout_RDX_03;
    } while (lVar7 < (this->super_PointCloud).n);
  }
  PLYWriter::close(&local_278,iVar4);
  PLYWriter::~PLYWriter(&local_278);
  return;
}

Assistant:

void ColoredPointCloud::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define header

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  ply.addProperty("diffuse_red", ply_uint8);
  ply.addProperty("diffuse_green", ply_uint8);
  ply.addProperty("diffuse_blue", ply_uint8);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    ply.write(getColorComp(i, 0));
    ply.write(getColorComp(i, 1));
    ply.write(getColorComp(i, 2));
  }

  ply.close();
}